

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O3

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::RequestsCache
          (RequestsCache *this,event_base *aEventBase,Action *aRetransmitter)

{
  _Rb_tree_header *p_Var1;
  _Any_data _Stack_38;
  code *local_28;
  
  std::function<void_(ot::commissioner::Timer_&)>::function
            ((function<void_(ot::commissioner::Timer_&)> *)&_Stack_38,aRetransmitter);
  Timer::Timer(&this->mRetransmissionTimer,aEventBase,(Action *)&_Stack_38,true);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  p_Var1 = &(this->mContainer)._M_t._M_impl.super__Rb_tree_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

RequestsCache(struct event_base *aEventBase, Timer::Action aRetransmitter)
            : mRetransmissionTimer(aEventBase, aRetransmitter)
        {
        }